

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O3

void __thiscall chrono::ChLinkUniversal::ConstraintsFetch_react(ChLinkUniversal *this,double factor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ChBodyFrame *pCVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ChMatrix33<double> mat2;
  ChMatrix33<double> *local_68;
  ChMatrix33<double> *local_60;
  ChMatrix33<double> local_58;
  
  dVar24 = factor * (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.l_i;
  pCVar23 = (this->super_ChLink).Body2;
  dVar27 = factor * (this->m_cnstr_x).super_ChConstraintTwo.super_ChConstraint.l_i;
  local_68 = &(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  dVar25 = factor * (this->m_cnstr_z).super_ChConstraintTwo.super_ChConstraint.l_i;
  dVar26 = factor * (this->m_cnstr_y).super_ChConstraintTwo.super_ChConstraint.l_i;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(double *)
                  ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 8);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       dVar26 * *(double *)
                 ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar27;
  auVar1 = vfmadd231sd_fma(auVar28,auVar43,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       dVar26 * *(double *)
                 ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x18);
  auVar2 = vfmadd231sd_fma(auVar52,auVar43,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(double *)
                  ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x10);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar27;
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       dVar26 * *(double *)
                 ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x28);
  auVar3 = vfmadd231sd_fma(auVar49,auVar44,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(double *)
                  ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x38);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar25;
  auVar1 = vfmadd231sd_fma(auVar1,auVar35,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x30);
  auVar2 = vfmadd231sd_fma(auVar2,auVar35,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x40);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar25;
  auVar3 = vfmadd231sd_fma(auVar3,auVar36,auVar6);
  dVar27 = auVar1._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x10);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       dVar27 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x28);
  auVar1 = vfmadd231sd_fma(auVar37,auVar2,auVar7);
  auVar29._0_8_ =
       dVar27 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x18);
  auVar29._8_8_ =
       dVar27 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x20);
  auVar45._8_8_ = auVar2._0_8_;
  auVar45._0_8_ = auVar2._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x40);
  auVar2 = vfmadd231sd_fma(auVar1,auVar3,auVar8);
  auVar1 = vfmadd132pd_fma(auVar45,auVar29,
                           *(undefined1 (*) [16])
                            (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar30._8_8_ = auVar3._0_8_;
  auVar30._0_8_ = auVar3._0_8_;
  auVar1 = vfmadd132pd_fma(auVar30,auVar1,
                           *(undefined1 (*) [16])
                            ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + 0x30));
  *(undefined1 (*) [16])(this->super_ChLink).react_force.m_data = auVar1;
  (this->super_ChLink).react_force.m_data[2] = auVar2._0_8_;
  pCVar23 = (this->super_ChLink).Body1;
  dVar27 = *(double *)
            ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 0x18);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       *(double *)
        ((long)(this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x30);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data + 0x30);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       dVar27 * *(double *)
                 ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x38);
  auVar1 = vfmadd231sd_fma(auVar50,auVar31,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       dVar27 * *(double *)
                 ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 8);
  auVar2 = vfmadd231sd_fma(auVar53,auVar31,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       *(double *)
        ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x18
        );
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       dVar27 * *(double *)
                 ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                         super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data + 0x20);
  auVar3 = vfmadd231sd_fma(auVar38,auVar31,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       *(double *)
        ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x40
        );
  auVar1 = vfmadd231sd_fma(auVar1,auVar46,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       *(double *)
        ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x10
        );
  auVar2 = vfmadd231sd_fma(auVar2,auVar46,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       *(double *)
        ((long)&(pCVar23->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 0x28
        );
  auVar3 = vfmadd231sd_fma(auVar3,auVar46,auVar14);
  local_60 = &this->m_v2_tilde;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_58,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_68);
  dVar27 = dVar24 * auVar1._0_8_;
  dVar25 = dVar24 * auVar2._0_8_;
  dVar24 = dVar24 * auVar3._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar25;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       dVar24 * local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar1 = vfmadd231sd_fma(auVar47,auVar39,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       dVar24 * local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar2 = vfmadd231sd_fma(auVar54,auVar39,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar25;
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       dVar24 * local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar3 = vfmadd231sd_fma(auVar51,auVar40,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar27;
  auVar1 = vfmadd231sd_fma(auVar1,auVar32,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar2 = vfmadd231sd_fma(auVar2,auVar32,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar27;
  auVar3 = vfmadd231sd_fma(auVar3,auVar33,auVar20);
  dVar27 = auVar1._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x10);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       dVar27 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x28);
  auVar1 = vfnmsub231sd_fma(auVar34,auVar2,auVar21);
  auVar41._0_8_ =
       dVar27 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x18);
  auVar41._8_8_ =
       dVar27 * *(double *)
                 ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x20);
  auVar48._8_8_ = auVar2._0_8_;
  auVar48._0_8_ = auVar2._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       *(double *)
        ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x40);
  auVar2 = vfnmadd231sd_fma(auVar1,auVar3,auVar22);
  auVar1 = vfnmsub132pd_fma(auVar48,auVar41,
                            *(undefined1 (*) [16])
                             (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar42._8_8_ = auVar3._0_8_;
  auVar42._0_8_ = auVar3._0_8_;
  auVar1 = vfnmadd132pd_fma(auVar42,auVar1,
                            *(undefined1 (*) [16])
                             ((long)(this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                    m_storage.m_data.array + 0x30));
  *(undefined1 (*) [16])(this->super_ChLink).react_torque.m_data = auVar1;
  (this->super_ChLink).react_torque.m_data[2] = auVar2._0_8_;
  return;
}

Assistant:

void ChLinkUniversal::ConstraintsFetch_react(double factor) {
    // Extract the Lagrange multipliers for the 3 spherical constraints and for
    // the dot constraint.
    ChVector<> lam_sph(m_cnstr_x.Get_l_i(), m_cnstr_y.Get_l_i(), m_cnstr_z.Get_l_i());
    double lam_dot = m_cnstr_dot.Get_l_i();

    // Note that the Lagrange multipliers must be multiplied by 'factor' to
    // convert from reaction impulses to reaction forces.
    lam_sph *= factor;
    lam_dot *= factor;

    // Calculate the reaction force and torque acting on the 2nd body at the joint
    // location, expressed in the joint reference frame.  Taking into account the
    // sign with which Lagrange multipliers show up in the EOM in Chrono, we get:
    //   F = C^T * A_2^T * Phi_r2^T * lam
    //   T = C^T * ( Phi_pi2^T - tilde(s2') * A_2^T * Phi_r2^T ) * lam
    // For the universal joint, after some manipulations, we have:
    //   F = C^T * A_2^T * lam_sph
    //   T = C^T * tilde(v2') *A_2^T * u1 * lam_dot
    //     = -C^T * [A_2 * tilde(v2')]^T * u1 * lam_dot

    // Reaction force
    ChVector<> F2 = Body2->GetA().transpose() * lam_sph;
    react_force = m_frame2.GetA().transpose() * F2;

    // Reaction torque
    ChVector<> u1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Xaxis());
    ChMatrix33<> mat2 = Body2->GetA() * m_v2_tilde;
    ChVector<> T2 = mat2.transpose() * (lam_dot * u1);
    react_torque = m_frame2.GetA().transpose() * (-T2);
}